

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int addk(FuncState *fs,TValue *k,TValue *v)

{
  lua_State *L;
  Proto *pPVar1;
  global_State *g;
  int iVar2;
  TValue *i_o;
  TValue *pTVar3;
  long lVar4;
  int *piVar5;
  TValue *o2;
  
  L = fs->L;
  pTVar3 = luaH_set(L,fs->h,k);
  if (pTVar3->tt == 3) {
    iVar2 = (int)(pTVar3->value).n;
  }
  else {
    pPVar1 = fs->f;
    piVar5 = &pPVar1->sizek;
    iVar2 = pPVar1->sizek;
    (pTVar3->value).n = (double)fs->nk;
    pTVar3->tt = 3;
    if (*piVar5 <= fs->nk) {
      pTVar3 = (TValue *)luaM_growaux_(L,pPVar1->k,piVar5,0x10,0x3ffff,"constant table overflow");
      pPVar1->k = pTVar3;
    }
    if (iVar2 < *piVar5) {
      lVar4 = (long)*piVar5 - (long)iVar2;
      piVar5 = &pPVar1->k[iVar2].tt;
      do {
        *piVar5 = 0;
        piVar5 = piVar5 + 4;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    pTVar3 = pPVar1->k;
    iVar2 = fs->nk;
    pTVar3[iVar2].value = v->value;
    pTVar3[iVar2].tt = v->tt;
    if (((3 < v->tt) && (((((v->value).gc)->gch).marked & 3) != 0)) && ((pPVar1->marked & 4) != 0))
    {
      g = L->l_G;
      if (g->gcstate == '\x01') {
        reallymarkobject(g,(v->value).gc);
      }
      else {
        pPVar1->marked = g->currentwhite & 3 | pPVar1->marked & 0xf8;
      }
    }
    iVar2 = fs->nk;
    fs->nk = iVar2 + 1;
  }
  return iVar2;
}

Assistant:

static int addk(FuncState*fs,TValue*k,TValue*v){
lua_State*L=fs->L;
TValue*idx=luaH_set(L,fs->h,k);
Proto*f=fs->f;
int oldsize=f->sizek;
if(ttisnumber(idx)){
return cast_int(nvalue(idx));
}
else{
setnvalue(idx,cast_num(fs->nk));
luaM_growvector(L,f->k,fs->nk,f->sizek,TValue,
((1<<(9+9))-1),"constant table overflow");
while(oldsize<f->sizek)setnilvalue(&f->k[oldsize++]);
setobj(L,&f->k[fs->nk],v);
luaC_barrier(L,f,v);
return fs->nk++;
}
}